

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  uint uVar10;
  void *pvVar11;
  MessageLite *msg_00;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  uint uVar15;
  ParseContext *extraout_RDX;
  ParseContext *pPVar16;
  ushort uVar17;
  RepeatedPtrFieldBase *ptr_00;
  RepeatedPtrFieldBase *ptr_01;
  Arena *arena;
  uint *puVar18;
  long *unaff_R15;
  pair<const_char_*,_unsigned_int> pVar19;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_70;
  RepeatedPtrFieldBase *local_48;
  TcParser local_40 [16];
  
  puVar18 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar18 & 3) != 0) {
LAB_00160eb5:
    AlignFail(puVar18);
  }
  uVar6 = *(ushort *)((long)puVar18 + 10);
  if ((uVar6 & 0x30) == 0x20) {
    if ((uVar6 & 0x1c0) == 0x40) {
      uVar10 = data.field_0._0_4_;
      if ((uVar10 & 7) != 3) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_00160e16:
        pcVar13 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar13;
      }
      pvVar11 = MaybeGetSplitBase(msg,true,table);
      unaff_R15 = (long *)((ulong)*puVar18 + (long)pvVar11);
      if (((ulong)unaff_R15 & 7) == 0) {
        local_48 = (RepeatedPtrFieldBase *)*unaff_R15;
        if (local_48 == (RepeatedPtrFieldBase *)kZeroBuffer) {
          arena = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          local_48 = Arena::CreateArenaCompatible<google::protobuf::internal::RepeatedPtrFieldBase>
                               (arena);
          *unaff_R15 = (long)local_48;
        }
        aVar14.data = (long)&table->has_bits_offset + (ulong)table->aux_offset;
        local_70 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                    (aVar14.data + (ulong)(ushort)puVar18[2] * 8);
        uVar17 = uVar6 >> 9 & 3;
        ptr_00 = (RepeatedPtrFieldBase *)ptr;
        if (uVar17 != 2) {
          if ((uVar6 >> 9 & 3) == 0) {
            MpRepeatedMessageOrGroup<true,true>(local_40);
            goto LAB_00160f1c;
          }
          if (uVar17 != 1) {
            local_70.data = *local_70.data;
          }
          local_70.data = (uint64_t)MessageLite::GetTcParseTable(local_70.data);
        }
        do {
          ptr_01 = local_48;
          msg_00 = AddMessage((TcParseTableBase *)local_70,local_48);
          uVar15 = ctx->depth_;
          puVar18 = (uint *)(ulong)uVar15;
          ctx->depth_ = uVar15 - 1;
          pPVar16 = ctx;
          if ((int)uVar15 < 1) {
LAB_00160e42:
            pcVar13 = Error(msg,(char *)ptr_01,pPVar16,(TcFieldData)aVar14,table,hasbits);
            return pcVar13;
          }
          iVar7 = ctx->group_depth_;
          uVar1 = iVar7 + 1;
          ctx->group_depth_ = uVar1;
          aVar14 = local_70;
          ptr = ParseLoopPreserveNone(msg_00,(char *)ptr_00,ctx,(TcParseTableBase *)local_70);
          pPVar16 = extraout_RDX;
          if ((ushort *)ptr == (ushort *)0x0) {
            uVar2 = ctx->depth_;
            uVar3 = ctx->group_depth_;
            ctx->depth_ = uVar2 + 1;
            ctx->group_depth_ = uVar3 + -1;
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
            ptr_01 = ptr_00;
            goto LAB_00160e42;
          }
          if (uVar15 - 1 != ctx->depth_) {
            MpRepeatedMessageOrGroup<true,true>();
LAB_00160ea8:
            MpRepeatedMessageOrGroup<true,true>();
            goto LAB_00160eb5;
          }
          uVar8 = ctx->group_depth_;
          if (uVar1 != uVar8) goto LAB_00160ea8;
          ctx->group_depth_ = iVar7;
          ctx->depth_ = uVar15;
          uVar15 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          ptr_01 = (RepeatedPtrFieldBase *)(ulong)uVar8;
          if (((ushort *)ptr == (ushort *)0x0) || (uVar15 != uVar10)) goto LAB_00160e42;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_00160e64;
          bVar4 = (byte)*(ushort *)ptr;
          auVar9[8] = bVar4;
          auVar9._0_8_ = (byte *)((long)ptr + 1);
          auVar9._9_3_ = 0;
          if ((char)bVar4 < '\0') {
            bVar5 = *(byte *)((long)ptr + 1);
            aVar14.data = (ulong)bVar5 << 7;
            uVar15 = ((uint)bVar4 + (uint)bVar5 * 0x80) - 0x80;
            if ((char)bVar5 < '\0') {
              ptr_01 = (RepeatedPtrFieldBase *)(ulong)uVar15;
              pVar19 = ReadTagFallback(ptr,uVar15);
              auVar9 = pVar19._0_12_;
              pPVar16 = pVar19._8_8_;
              if (pVar19.first == (char *)0x0) goto LAB_00160e42;
            }
            else {
              auVar9._8_4_ = uVar15;
              auVar9._0_8_ = (ushort *)((long)ptr + 2);
            }
          }
          ptr_00 = auVar9._0_8_;
        } while (auVar9._8_4_ == uVar10);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_00160e64:
          if ((ulong)table->has_bits_offset != 0) {
            puVar18 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
            if (((ulong)puVar18 & 3) != 0) {
LAB_00160f1c:
              AlignFail();
            }
            *puVar18 = *puVar18 | (uint)hasbits;
          }
          return (char *)(ushort *)ptr;
        }
        uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
        if ((uVar10 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar12 = (ulong)(uVar10 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
        goto LAB_00160e16;
      }
      goto LAB_00160ed1;
    }
  }
  else {
    MpRepeatedMessageOrGroup<true,true>();
  }
  MpRepeatedMessageOrGroup<true,true>();
LAB_00160ed1:
  AlignFail(unaff_R15);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}